

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall
efsw::DirectorySnapshot::moveFile(DirectorySnapshot *this,string *oldPath,string *newPath)

{
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)oldPath);
  removeFile(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&sStack_58,(string *)newPath);
  addFile(this,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void DirectorySnapshot::moveFile( std::string oldPath, std::string newPath ) {
	removeFile( oldPath );
	addFile( newPath );
}